

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O2

void deblock_edge_luma_ver(pel *src,int stride,int Alpha,int Beta,int edge_flag)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  byte *pbVar16;
  int iVar17;
  byte *pbVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  bool bVar22;
  uint local_60;
  
  iVar19 = (uint)((~edge_flag & 0x101U) == 0) * 4 + 4;
  iVar10 = 0;
  if ((edge_flag & 1U) == 0) {
    iVar10 = stride * 4;
  }
  pbVar18 = src + iVar10;
  do {
    bVar22 = iVar19 == 0;
    iVar19 = iVar19 + -1;
    if (bVar22) {
      return;
    }
    bVar6 = pbVar18[-3];
    bVar1 = pbVar18[-2];
    bVar2 = pbVar18[-1];
    uVar14 = (uint)bVar2;
    bVar3 = *pbVar18;
    uVar20 = (uint)bVar3;
    bVar4 = pbVar18[1];
    bVar5 = pbVar18[2];
    uVar7 = uVar20 - bVar2;
    uVar13 = -uVar7;
    if (0 < (int)uVar7) {
      uVar13 = uVar7;
    }
    uVar8 = (uint)bVar1 - (uint)bVar2;
    uVar7 = -uVar8;
    if (0 < (int)uVar8) {
      uVar7 = uVar8;
    }
    uVar9 = (uint)bVar3 - (uint)bVar4;
    uVar8 = -uVar9;
    if (0 < (int)uVar9) {
      uVar8 = uVar9;
    }
    uVar15 = (uint)bVar2;
    uVar12 = bVar6 - uVar15;
    uVar9 = -uVar12;
    if (0 < (int)uVar12) {
      uVar9 = uVar12;
    }
    uVar21 = (uint)bVar3;
    uVar11 = uVar20 - bVar5;
    uVar12 = -uVar11;
    if (0 < (int)uVar11) {
      uVar12 = uVar11;
    }
    iVar17 = (uint)((int)(uVar9 & 0xff) < Beta) + (uint)((int)(uVar7 & 0xff) < Beta) * 2;
    iVar10 = iVar17 + (uint)((int)(uVar8 & 0xff) < Beta) * 2 + (uint)((int)(uVar12 & 0xff) < Beta);
    if (3 < iVar10 - 3U) goto LAB_00112c37;
    uVar7 = (uint)bVar3;
    uVar9 = (uint)bVar1;
    pbVar16 = pbVar18;
    switch(iVar10) {
    case 3:
      local_60 = (uint)bVar4;
      iVar17 = uVar9 - local_60;
      iVar10 = -iVar17;
      if (0 < iVar17) {
        iVar10 = iVar17;
      }
      if (Beta <= iVar10) goto LAB_00112c37;
LAB_00112c15:
      pbVar18[-1] = (byte)(uVar14 * 3 + uVar7 + 2 >> 2);
      bVar6 = (byte)(uVar20 * 3 + (uint)bVar2 + 2 >> 2);
      break;
    case 4:
      if (iVar17 != 2) goto LAB_00112c15;
      goto LAB_00112bde;
    case 5:
      if (bVar2 == bVar1 && bVar4 == bVar3) goto LAB_00112b67;
LAB_00112bde:
      pbVar18[-1] = (byte)((uint)bVar1 + (uint)bVar1 * 2 + uVar7 + (uint)bVar2 * 10 + uVar20 * 2 + 8
                          >> 4);
      bVar6 = (byte)(uVar14 * 3 + uVar20 * 10 + (uint)bVar4 * 3 + 8 >> 4);
      break;
    case 6:
      if ((int)(uVar8 & 0xff) <= Beta / 4) {
        uVar12 = uVar15 - bVar1;
        uVar8 = -uVar12;
        if (0 < (int)uVar12) {
          uVar8 = uVar12;
        }
        if ((uVar8 <= (uint)(Beta / 4)) && ((int)(uVar13 & 0xff) < Alpha)) {
          iVar10 = (uint)bVar1 + (uint)bVar6;
          pbVar18[-3] = (byte)(uVar14 + ((uint)pbVar18[-4] + iVar10) * 2 + uVar21 + 4 >> 3);
          pbVar18[-2] = (byte)(uVar20 * 3 + uVar9 + (iVar10 + uVar15) * 4 + 8 >> 4);
          uVar13 = (uint)bVar4;
          iVar10 = uVar15 + uVar21;
          pbVar18[-1] = (byte)((bVar6 + uVar13) * 3 + ((uint)bVar1 + iVar10) * 8 + uVar14 * 2 + 0x10
                              >> 5);
          uVar7 = (uint)bVar5;
          *pbVar18 = (byte)((uVar9 + uVar7) * 3 + (uVar13 + iVar10) * 8 + uVar20 * 2 + 0x10 >> 5);
          pbVar18[1] = (byte)(uVar14 * 3 + (uint)bVar4 + (uVar21 + uVar13 + uVar7) * 4 + 8 >> 4);
          bVar6 = (byte)(iVar10 + 4 + (uVar7 + bVar4 + (uint)pbVar18[3]) * 2 >> 3);
          pbVar16 = pbVar18 + 2;
          break;
        }
      }
LAB_00112b67:
      pbVar18[-2] = (byte)((uint)bVar6 * 3 + (uint)bVar2 * 4 + 8 + (uint)bVar1 * 8 + uVar7 >> 4);
      pbVar18[-1] = (byte)((uint)bVar6 + (uint)bVar1 * 4 + (uint)bVar2 * 4 + 8 + (uint)bVar2 * 2 +
                           (uint)bVar3 * 4 + (uint)bVar4 >> 4);
      *pbVar18 = (byte)((uint)bVar1 + (uint)bVar2 * 4 + 8 + uVar20 * 6 + (uint)bVar4 * 4 +
                        (uint)bVar5 >> 4);
      bVar6 = (byte)((uint)bVar5 + (uint)bVar5 * 2 + uVar14 + uVar20 * 4 + (uint)bVar4 * 8 + 8 >> 4)
      ;
      pbVar16 = pbVar18 + 1;
    }
    *pbVar16 = bVar6;
LAB_00112c37:
    pbVar18 = pbVar18 + stride;
  } while( true );
}

Assistant:

void deblock_edge_luma_ver(pel *src, int stride, int Alpha, int Beta, int edge_flag)
{
    int i, line_size = 8;

    if ((edge_flag & 0x0101) != 0x0101) {
        line_size = 4;
    }
    if (!(edge_flag & 0x1)) {
        src += 4 * stride;
    }

    for (i = 0; i < line_size; i++, src += stride) {
        int L3 = src[-4];
        int L2 = src[-3];
        int L1 = src[-2];
        int L0 = src[-1];
        int R0 = src[0];
        int R1 = src[1];
        int R2 = src[2];
        int R3 = src[3];
        int abs0 = COM_ABS(R0 - L0);
        int flat_l = (COM_ABS(L1 - L0) < Beta) ? 2 : 0;
        int flat_r = (COM_ABS(R0 - R1) < Beta) ? 2 : 0;
        int fs;

        if (COM_ABS(L2 - L0) < Beta) {
            flat_l++;
        }
        if (COM_ABS(R0 - R2) < Beta) {
            flat_r++;
        }

        switch (flat_l + flat_r) {
        case 6:
            fs = (COM_ABS(R0 - R1) <= Beta / 4 && COM_ABS(L0 - L1) <= Beta / 4 && abs0 < Alpha) ? 4 : 3;
            break;
        case 5:
            fs = (R1 == R0 && L0 == L1) ? 3 : 2;
            break;
        case 4:
            fs = (flat_l == 2) ? 2 : 1;
            break;
        case 3:
            fs = (COM_ABS(L1 - R1) < Beta) ? 1 : 0;
            break;
        default:
            fs = 0;
            break;
        }

        switch (fs) {
        case 4:
            src[-3] = (pel)((((L3 + L2 + L1) << 1) + L0 + R0 + 4) >> 3);                          //L2
            src[-2] = (pel)((((L2 + L0 + L1) << 2) + L1 + R0 * 3 + 8) >> 4);                      //L1
            src[-1] = (pel)(((L2 + R1) * 3 + ((L1 + L0 + R0) << 3) + (L0 << 1) + 16) >> 5);       //L0
            src[ 0] = (pel)(((R2 + L1) * 3 + ((R1 + R0 + L0) << 3) + (R0 << 1) + 16) >> 5);       //R0
            src[ 1] = (pel)((((R2 + R1 + R0) << 2) + R1 + L0 * 3 + 8) >> 4);                      //R1
            src[ 2] = (pel)((((R3 + R2 + R1) << 1) + R0 + L0 + 4) >> 3);                          //R2
            break;
        case 3:
            src[-2] = (pel)((L2 * 3 + L1 * 8 + L0 * 4 + R0 + 8) >> 4);                           //L1
            src[-1] = (pel)((L2 + (L1 << 2) + (L0 << 2) + (L0 << 1) + (R0 << 2) + R1 + 8) >> 4); //L0
            src[ 0] = (pel)((L1 + (L0 << 2) + (R0 << 2) + (R0 << 1) + (R1 << 2) + R2 + 8) >> 4); //R0
            src[ 1] = (pel)((R2 * 3 + R1 * 8 + R0 * 4 + L0 + 8) >> 4);                           //R1
            break;
        case 2:
            src[-1] = (pel)(((L1 << 1) + L1 + (L0 << 3) + (L0 << 1) + (R0 << 1) + R0 + 8) >> 4);
            src[ 0] = (pel)(((L0 << 1) + L0 + (R0 << 3) + (R0 << 1) + (R1 << 1) + R1 + 8) >> 4);
            break;
        case 1:
            src[-1] = (pel)((L0 * 3 + R0 + 2) >> 2);
            src[ 0] = (pel)((R0 * 3 + L0 + 2) >> 2);
            break;
        default:
            break;
        }
    }
}